

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

void tclpkcs11_int_unload_module(void *handle)

{
  void *handle_local;
  
  dlclose(handle);
  return;
}

Assistant:

MODULE_SCOPE void tclpkcs11_int_unload_module(void *handle) {
  #if defined(TCL_INCLUDES_LOADFILE)
  Tcl_LoadHandle *tcl_handle;

  tcl_handle = handle;

  Tcl_FSUnloadFile(NULL, *tcl_handle);

  ckfree(handle);
  #elif defined(HAVE_DLOPEN)
  dlclose(handle);
  #elif defined(HAVE_SHL_LOAD)
  shl_unload(handle);
  #elif defined(_WIN32)
  FreeLibrary(handle);
  #endif
  return;
}